

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O2

void __thiscall
embree::Geometry::setTransform(Geometry *this,AffineSpace3fa *transform,uint timeStep)

{
  undefined8 *puVar1;
  undefined4 in_register_00000014;
  allocator local_39;
  string local_38 [32];
  
  puVar1 = (undefined8 *)
           __cxa_allocate_exception(0x30,transform,CONCAT44(in_register_00000014,timeStep));
  std::__cxx11::string::string(local_38,"operation not supported for this geometry",&local_39);
  *puVar1 = &PTR__rtcore_error_002496e8;
  *(undefined4 *)(puVar1 + 1) = 3;
  std::__cxx11::string::string((string *)(puVar1 + 2),local_38);
  __cxa_throw(puVar1,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
}

Assistant:

virtual void setTransform(const AffineSpace3fa& transform, unsigned int timeStep) {
      throw_RTCError(RTC_ERROR_INVALID_OPERATION,"operation not supported for this geometry"); 
    }